

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
::
emplace_new_key<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
          *key)

{
  PortInfo *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  DeclaratorSyntax *pDVar6;
  pointer ppAVar7;
  size_type sVar8;
  Symbol *pSVar9;
  Definition *pDVar10;
  not_null<const_slang::syntax::DeclaratorSyntax_*> nVar11;
  undefined6 uVar12;
  undefined2 uVar13;
  undefined6 uVar14;
  undefined2 uVar15;
  undefined6 uVar16;
  long lVar17;
  EntryPointer psVar18;
  undefined7 in_register_00000031;
  long lVar19;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  *ppVar20;
  EntryPointer psVar21;
  anon_union_80_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>_3
  *paVar22;
  char cVar23;
  char __tmp_3;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
  sVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_bool>
  pVar27;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  value_type to_insert;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
  local_68;
  
  if (*(long *)(this + 0x10) != 0) {
    psVar18 = (EntryPointer)(CONCAT71(in_register_00000031,distance_from_desired) & 0xffffffff);
    sVar24 = SUB81(psVar18,0);
    if (this[0x19] != sVar24) {
      lVar19 = *(long *)(this + 0x20) + 1;
      auVar25._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar25._0_8_ = lVar19;
      auVar25._12_4_ = 0x45300000;
      lVar17 = *(long *)(this + 0x10) + 1;
      auVar26._8_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar26._0_8_ = lVar17;
      auVar26._12_4_ = 0x45300000;
      if ((auVar25._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0) <=
          (double)*(float *)(this + 0x1c) *
          ((auVar26._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0))) {
        cVar23 = current_entry->distance_from_desired;
        if (cVar23 < '\0') {
          paVar22 = &current_entry->field_1;
          for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
            (paVar22->value).first._M_len = (key->first)._M_len;
            key = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)&(key->first)._M_str;
            paVar22 = (anon_union_80_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>_3
                       *)((long)paVar22 + 8);
          }
          current_entry->distance_from_desired = (int8_t)sVar24;
        }
        else {
          ppVar20 = &local_68;
          for (lVar17 = 10; uVar14 = local_68.second._56_6_,
              uVar15 = local_68.second.modport._M_str._6_2_,
              uVar12 = local_68.second.modport._M_str._0_6_,
              uVar13 = local_68.second.modport._M_len._6_2_, pDVar10 = local_68.second.ifaceDef,
              pSVar9 = local_68.second.internalSymbol, sVar8 = local_68.second.attrs.size_,
              ppAVar7 = local_68.second.attrs.data_, nVar11.ptr = local_68.second.syntax.ptr,
              pcVar5 = local_68.first._M_str, sVar4 = local_68.first._M_len, lVar17 != 0;
              lVar17 = lVar17 + -1) {
            (ppVar20->first)._M_len = (key->first)._M_len;
            key = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                   *)&(key->first)._M_str;
            ppVar20 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                       *)&(ppVar20->first)._M_str;
          }
          current_entry->distance_from_desired = (int8_t)sVar24;
          local_68.first._M_len = (current_entry->field_1).value.first._M_len;
          local_68.first._M_str = (current_entry->field_1).value.first._M_str;
          (current_entry->field_1).value.first._M_len = sVar4;
          (current_entry->field_1).value.first._M_str = pcVar5;
          sVar4 = CONCAT26(local_68.second.modport._M_len._6_2_,
                           (undefined6)local_68.second.modport._M_len);
          uVar2 = *(undefined8 *)((long)&current_entry->field_1 + 0x38);
          uVar3 = *(undefined8 *)((long)&current_entry->field_1 + 0x46);
          local_68.second.modport._M_str._0_6_ =
               (undefined6)((ulong)*(undefined8 *)((long)&current_entry->field_1 + 0x3e) >> 0x10);
          local_68.second.modport._M_str._6_2_ = (undefined2)uVar3;
          local_68.second._56_6_ = SUB86((ulong)uVar3 >> 0x10,0);
          local_68.second.ifaceDef = (current_entry->field_1).value.second.ifaceDef;
          local_68.second.modport._M_len._0_6_ = (undefined6)uVar2;
          local_68.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
          local_68.second.attrs.size_ = (current_entry->field_1).value.second.attrs.size_;
          local_68.second.internalSymbol = (current_entry->field_1).value.second.internalSymbol;
          local_68.second.syntax.ptr = (current_entry->field_1).value.second.syntax.ptr;
          local_68.second.attrs.data_ = (current_entry->field_1).value.second.attrs.data_;
          *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_len + 6) =
               CONCAT62(uVar12,uVar13);
          *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_str + 6) =
               CONCAT62(uVar14,uVar15);
          (current_entry->field_1).value.second.ifaceDef = pDVar10;
          (current_entry->field_1).value.second.modport._M_len = sVar4;
          (current_entry->field_1).value.second.attrs.size_ = sVar8;
          (current_entry->field_1).value.second.internalSymbol = pSVar9;
          (current_entry->field_1).value.second.syntax.ptr = nVar11.ptr;
          (current_entry->field_1).value.second.attrs.data_ = ppAVar7;
          sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                    )(cVar23 + '\x01');
          psVar18 = current_entry + 1;
          cVar23 = current_entry[1].distance_from_desired;
          psVar21 = current_entry;
          if (-1 < cVar23) {
            pPVar1 = &(current_entry->field_1).value.second;
            do {
              psVar21 = psVar18;
              uVar16 = local_68.second._56_6_;
              uVar15 = local_68.second.modport._M_str._6_2_;
              uVar14 = local_68.second.modport._M_str._0_6_;
              uVar13 = local_68.second.modport._M_len._6_2_;
              uVar12 = (undefined6)local_68.second.modport._M_len;
              pDVar10 = local_68.second.ifaceDef;
              pSVar9 = local_68.second.internalSymbol;
              sVar8 = local_68.second.attrs.size_;
              ppAVar7 = local_68.second.attrs.data_;
              nVar11.ptr = local_68.second.syntax.ptr;
              pcVar5 = local_68.first._M_str;
              sVar4 = local_68.first._M_len;
              if (cVar23 < (char)sVar24) {
                psVar21->distance_from_desired = (int8_t)sVar24;
                local_68.first._M_len = (psVar21->field_1).value.first._M_len;
                local_68.first._M_str = (psVar21->field_1).value.first._M_str;
                (psVar21->field_1).value.first._M_len = sVar4;
                (psVar21->field_1).value.first._M_str = pcVar5;
                uVar2 = *(undefined8 *)((long)&psVar21->field_1 + 0x38);
                uVar3 = *(undefined8 *)((long)&psVar21->field_1 + 0x46);
                local_68.second.modport._M_str._0_6_ =
                     (undefined6)((ulong)*(undefined8 *)((long)&psVar21->field_1 + 0x3e) >> 0x10);
                local_68.second.modport._M_str._6_2_ = (undefined2)uVar3;
                local_68.second._56_6_ = SUB86((ulong)uVar3 >> 0x10,0);
                local_68.second.ifaceDef = (psVar21->field_1).value.second.ifaceDef;
                local_68.second.modport._M_len._0_6_ = (undefined6)uVar2;
                local_68.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
                local_68.second.attrs.size_ = (psVar21->field_1).value.second.attrs.size_;
                local_68.second.internalSymbol = (psVar21->field_1).value.second.internalSymbol;
                local_68.second.syntax.ptr = (psVar21->field_1).value.second.syntax.ptr;
                local_68.second.attrs.data_ = (psVar21->field_1).value.second.attrs.data_;
                *(ulong *)((long)&(psVar21->field_1).value.second.modport._M_len + 6) =
                     CONCAT62(uVar14,uVar13);
                *(ulong *)((long)&(psVar21->field_1).value.second.modport._M_str + 6) =
                     CONCAT62(uVar16,uVar15);
                (psVar21->field_1).value.second.ifaceDef = pDVar10;
                (psVar21->field_1).value.second.modport._M_len = CONCAT26(uVar13,uVar12);
                (psVar21->field_1).value.second.attrs.size_ = sVar8;
                (psVar21->field_1).value.second.internalSymbol = pSVar9;
                (psVar21->field_1).value.second.syntax.ptr = nVar11.ptr;
                (psVar21->field_1).value.second.attrs.data_ = ppAVar7;
                sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                          )(cVar23 + '\x01');
              }
              else {
                sVar24 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>,8ul>>
                          )((char)sVar24 + '\x01');
                if (sVar24 == this[0x19]) {
                  key = &local_68;
                  sVar4 = (current_entry->field_1).value.first._M_len;
                  pcVar5 = (current_entry->field_1).value.first._M_str;
                  (current_entry->field_1).value.first._M_len = local_68.first._M_len;
                  (current_entry->field_1).value.first._M_str = local_68.first._M_str;
                  pDVar6 = (pPVar1->syntax).ptr;
                  ppAVar7 = (current_entry->field_1).value.second.attrs.data_;
                  sVar8 = (current_entry->field_1).value.second.attrs.size_;
                  pSVar9 = (current_entry->field_1).value.second.internalSymbol;
                  pDVar10 = (current_entry->field_1).value.second.ifaceDef;
                  uVar2 = *(undefined8 *)((long)&current_entry->field_1 + 0x38);
                  uVar3 = *(undefined8 *)((long)&current_entry->field_1 + 0x46);
                  local_68.second.modport._M_str._0_6_ =
                       (undefined6)
                       ((ulong)*(undefined8 *)((long)&current_entry->field_1 + 0x3e) >> 0x10);
                  local_68.second.modport._M_str._6_2_ = (undefined2)uVar3;
                  local_68.second._56_6_ = SUB86((ulong)uVar3 >> 0x10,0);
                  local_68.second.modport._M_len._0_6_ = (undefined6)uVar2;
                  local_68.second.modport._M_len._6_2_ = (undefined2)((ulong)uVar2 >> 0x30);
                  (current_entry->field_1).value.second.ifaceDef = local_68.second.ifaceDef;
                  (current_entry->field_1).value.second.modport._M_len = CONCAT26(uVar13,uVar12);
                  *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_len + 6) =
                       CONCAT62(uVar14,uVar13);
                  *(ulong *)((long)&(current_entry->field_1).value.second.modport._M_str + 6) =
                       CONCAT62(uVar16,uVar15);
                  (current_entry->field_1).value.second.attrs.size_ = local_68.second.attrs.size_;
                  (current_entry->field_1).value.second.internalSymbol =
                       local_68.second.internalSymbol;
                  (pPVar1->syntax).ptr = local_68.second.syntax.ptr;
                  (current_entry->field_1).value.second.attrs.data_ = local_68.second.attrs.data_;
                  local_68.first._M_len = sVar4;
                  local_68.first._M_str = pcVar5;
                  local_68.second.syntax.ptr = pDVar6;
                  local_68.second.attrs.data_ = ppAVar7;
                  local_68.second.attrs.size_ = sVar8;
                  local_68.second.internalSymbol = pSVar9;
                  local_68.second.ifaceDef = pDVar10;
                  goto LAB_001e4223;
                }
              }
              cVar23 = psVar21[1].distance_from_desired;
              psVar18 = psVar21 + 1;
            } while (-1 < cVar23);
          }
          ppVar20 = &local_68;
          paVar22 = &psVar21[1].field_1;
          for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
            (paVar22->value).first._M_len = (ppVar20->first)._M_len;
            ppVar20 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>
                       *)&(ppVar20->first)._M_str;
            paVar22 = (anon_union_80_1_a8c68091_for_sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>_3
                       *)((long)paVar22 + 8);
          }
          psVar18->distance_from_desired = (int8_t)sVar24;
        }
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        pVar27._9_7_ = (int7)((ulong)psVar18 >> 8);
        pVar27.second = true;
        pVar27.first.current = current_entry;
        return pVar27;
      }
    }
  }
LAB_001e4223:
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>_>,_8UL>_>
          *)this);
  pVar27 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>>
                     (this,key);
  return pVar27;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }